

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O1

TSNode * ts_tree_cursor_current_node(TSNode *__return_storage_ptr__,TSTreeCursor *_self)

{
  uint32_t uVar1;
  TSTree *pTVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  uint uVar6;
  long lVar7;
  TreeCursor *self;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = _self->context[0];
  if (uVar1 != 0) {
    puVar5 = (undefined8 *)((ulong)(uVar1 - 1) * 0x20 + (long)_self->id);
    uVar6 = 0;
    if (uVar1 != 1) {
      uVar9 = (ulong)*(ushort *)(**(long **)((long)_self->id + (ulong)(uVar1 - 2) * 0x20) + 0x4c);
      if (uVar9 == 0) {
        lVar7 = 0;
      }
      else {
        lVar7 = *(long *)((long)_self->tree + 8);
        lVar7 = *(ushort *)(lVar7 + 0x48) * uVar9 * 2 + *(long *)(lVar7 + 0x40);
      }
      uVar6 = 0;
      if (lVar7 != 0) {
        uVar9 = *(ulong *)*puVar5;
        if ((uVar9 & 1) == 0) {
          uVar8 = *(uint *)(uVar9 + 0x2c) >> 2;
        }
        else {
          uVar8 = (uint)(uVar9 >> 3) & 0x1fffffff;
        }
        uVar6 = 0;
        if ((uVar8 & 1) == 0) {
          uVar6 = (uint)*(ushort *)(lVar7 + (ulong)*(uint *)(puVar5 + 3) * 2);
        }
      }
    }
    pTVar2 = (TSTree *)_self->tree;
    pvVar3 = (void *)*puVar5;
    uVar4 = puVar5[1];
    uVar1 = *(uint32_t *)(puVar5 + 2);
    __return_storage_ptr__->context[0] = (uint32_t)uVar4;
    __return_storage_ptr__->context[1] = (uint32_t)((ulong)uVar4 >> 0x20);
    __return_storage_ptr__->context[2] = uVar1;
    __return_storage_ptr__->context[3] = uVar6;
    __return_storage_ptr__->id = pvVar3;
    __return_storage_ptr__->tree = pTVar2;
    return __return_storage_ptr__;
  }
  __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/tree_cursor.c"
                ,0xe3,"TSNode ts_tree_cursor_current_node(const TSTreeCursor *)");
}

Assistant:

TSNode ts_tree_cursor_current_node(const TSTreeCursor *_self) {
  const TreeCursor *self = (const TreeCursor *)_self;
  TreeCursorEntry *last_entry = array_back(&self->stack);
  TSSymbol alias_symbol = 0;
  if (self->stack.size > 1) {
    TreeCursorEntry *parent_entry = &self->stack.contents[self->stack.size - 2];
    const TSSymbol *alias_sequence = ts_language_alias_sequence(
      self->tree->language,
      parent_entry->subtree->ptr->alias_sequence_id
    );
    if (alias_sequence && !ts_subtree_extra(*last_entry->subtree)) {
      alias_symbol = alias_sequence[last_entry->structural_child_index];
    }
  }
  return ts_node_new(
    self->tree,
    last_entry->subtree,
    last_entry->position,
    alias_symbol
  );
}